

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O2

void ThrowUnlessContains<unsigned_long>
               (unsigned_long x,vector<unsigned_long,_std::allocator<unsigned_long>_> *v,char *msg)

{
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var1;
  runtime_error *this;
  unsigned_long x_local;
  
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                    ((v->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                     super__Vector_impl_data._M_start,
                     (v->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                     super__Vector_impl_data._M_finish);
  if (_Var1._M_current !=
      (v->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,msg);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ThrowUnlessContains(T x, const std::vector<T>& v, const char* msg) {
  if (std::find(v.begin(), v.end(), x) == v.end()) {
    throw Error(msg);
  }
}